

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

char * btorsim_bv_to_hex_char(BtorSimBitVector *bv)

{
  long lVar1;
  uint32_t uVar2;
  BtorSimBitVector *__ptr;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  BtorSimBitVector *a;
  char *pcVar6;
  undefined8 extraout_RAX;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  BtorSimBitVector *pBVar11;
  size_t sVar12;
  long lVar13;
  uint uVar14;
  uint *__nmemb;
  char *pcVar15;
  byte bVar16;
  char cVar17;
  char *pcVar18;
  uint uVar19;
  bool bVar20;
  char *pcStack_68;
  BtorSimBitVector *pBStack_60;
  BtorSimBitVector *pBStack_58;
  BtorSimBitVector *pBStack_50;
  BtorSimBitVector *pBStack_48;
  
  uVar8 = bv->width;
  uVar19 = uVar8 + 3 >> 2;
  uVar5 = (ulong)uVar19;
  __nmemb = (uint *)(ulong)(uVar19 + 1);
  pcVar4 = (char *)calloc((size_t)__nmemb,1);
  if (pcVar4 != (char *)0x0) {
    if (uVar8 != 0) {
      uVar2 = bv->len;
      uVar19 = 0;
      do {
        bVar20 = ((&bv[1].width)[~(uVar19 >> 5) + uVar2] >> (uVar19 & 0x1f) & 1) != 0;
        uVar14 = (uint)bVar20;
        uVar19 = uVar19 + 1;
        if (uVar19 < uVar8) {
          uVar7 = 1;
          uVar14 = (uint)bVar20;
          do {
            uVar14 = (uint)(((&bv[1].width)[~(uVar19 >> 5) + uVar2] >> (uVar19 & 0x1f) & 1) != 0) <<
                     ((byte)uVar7 & 0x1f) | uVar14;
            uVar19 = uVar19 + 1;
            if (uVar8 <= uVar19) break;
            bVar20 = uVar7 < 3;
            uVar7 = uVar7 + 1;
          } while (bVar20);
        }
        uVar5 = (ulong)((int)uVar5 - 1);
        bVar16 = (byte)uVar14 + 0x57;
        if (uVar14 < 10) {
          bVar16 = (byte)uVar14 | 0x30;
        }
        pcVar4[uVar5] = bVar16;
      } while (uVar19 < uVar8);
    }
    return pcVar4;
  }
  btorsim_bv_to_hex_char_cold_1();
  uVar5 = (ulong)__nmemb[1];
  bVar20 = uVar5 == 0;
  if ((!bVar20) && (__nmemb[2] == 0)) {
    uVar3 = 1;
    do {
      uVar10 = uVar3;
      if (uVar5 == uVar10) break;
      uVar3 = uVar10 + 1;
    } while (__nmemb[uVar10 + 2] == 0);
    bVar20 = uVar5 <= uVar10;
  }
  pBStack_48 = bv;
  if (!bVar20) {
    if (*__nmemb < 4) {
      pBStack_58 = btorsim_bv_uint64_to_bv(10,4);
      a = btorsim_bv_new(4);
      uVar5 = (ulong)__nmemb[1];
      pBVar11 = (BtorSimBitVector *)((long)a + uVar5 * -4 + (ulong)a->len * 4);
    }
    else {
      pBStack_58 = btorsim_bv_uint64_to_bv(10,*__nmemb);
      a = btorsim_bv_new(*__nmemb);
      uVar5 = (ulong)__nmemb[1];
      pBVar11 = a;
    }
    memcpy(pBVar11 + 1,__nmemb + 2,uVar5 << 2);
    pcVar15 = (char *)0x0;
    pcVar4 = (char *)0x0;
    pcStack_68 = (char *)0x0;
    pBVar11 = pBStack_58;
    do {
      uVar5 = (ulong)a->len;
      bVar20 = uVar5 == 0;
      if ((!bVar20) && (a[1].width == 0)) {
        uVar3 = 1;
        do {
          uVar10 = uVar3;
          if (uVar5 == uVar10) break;
          uVar3 = uVar10 + 1;
        } while ((&a[1].width)[uVar10] == 0);
        bVar20 = uVar5 <= uVar10;
      }
      if (bVar20) {
        free(a);
        free(pBVar11);
        if (pcVar4 == pcStack_68) {
          pcVar6 = pcStack_68;
          if (pcVar4 == pcVar15) {
            sVar12 = 1;
            if (pcVar15 != pcStack_68) {
              sVar12 = ((long)pcVar15 - (long)pcStack_68) * 2;
            }
            pcVar4 = (char *)realloc(pcStack_68,sVar12);
            pcVar6 = pcVar4;
            if (pcVar4 == (char *)0x0) goto LAB_00113ec0;
          }
          pcStack_68 = pcVar6;
          *pcVar4 = '0';
          pcVar4 = pcVar4 + 1;
        }
        pcVar15 = pcVar4 + (1 - (long)pcStack_68);
        if (pcVar15 == (char *)0x0) {
          pcVar6 = (char *)0x0;
          pcVar18 = pcVar6;
        }
        else {
          pcVar6 = (char *)malloc((size_t)pcVar15);
          pcVar18 = pcVar6;
          if (pcVar6 == (char *)0x0) goto LAB_00113ebb;
        }
        for (; pcStack_68 < pcVar4; pcVar4 = pcVar4 + -1) {
          *pcVar6 = pcVar4[-1];
          pcVar6 = pcVar6 + 1;
        }
        *pcVar6 = '\0';
        free(pcStack_68);
        return pcVar18;
      }
      pBStack_60 = (BtorSimBitVector *)0x0;
      udiv_urem_bv(a,pBVar11,&pBStack_60,(BtorSimBitVector **)0x0);
      pBStack_50 = pBStack_60;
      pBStack_60 = (BtorSimBitVector *)0x0;
      udiv_urem_bv(a,pBVar11,(BtorSimBitVector **)0x0,&pBStack_60);
      __ptr = pBStack_60;
      uVar8 = pBStack_60->width;
      do {
        uVar8 = uVar8 - 1;
        uVar5 = 0xffffffff;
        if ((uVar8 == 0xffffffff) ||
           (uVar5 = (ulong)uVar8,
           ((&pBStack_60[1].width)[~(uVar8 >> 5) + pBStack_60->len] >> (uVar8 & 0x1f) & 1) != 0))
        break;
        uVar5 = 0xffffffff;
      } while (uVar8 != 0);
      if ((int)uVar5 == -1) {
        cVar17 = '0';
      }
      else {
        bVar16 = 0;
        do {
          uVar8 = (uint)uVar5;
          bVar16 = ((&pBStack_60[1].width)[~(uint)(uVar5 >> 5) + pBStack_60->len] >> (uVar8 & 0x1f)
                   & 1) != 0 | bVar16 * '\x02';
          uVar5 = (ulong)(uVar8 - 1);
        } while (uVar8 != 0);
        cVar17 = bVar16 + 0x30;
      }
      if (pcVar4 == pcVar15) {
        sVar12 = ((long)pcVar15 - (long)pcStack_68) * 2;
        if (pcVar15 == pcStack_68) {
          sVar12 = 1;
        }
        pcVar15 = pcStack_68;
        pcVar6 = (char *)realloc(pcStack_68,sVar12);
        if (pcVar6 == (char *)0x0) goto LAB_00113eb1;
        pcVar4 = pcVar6 + ((long)pcVar4 - (long)pcStack_68);
        pcVar15 = pcVar6 + sVar12;
        pBVar11 = pBStack_58;
        pcStack_68 = pcVar6;
      }
      *pcVar4 = cVar17;
      pcVar4 = pcVar4 + 1;
      free(__ptr);
      free(a);
      a = pBStack_50;
    } while( true );
  }
  pcVar15 = (char *)0x2;
  pcVar4 = (char *)calloc(2,1);
  if (pcVar4 != (char *)0x0) {
    *pcVar4 = '0';
    return pcVar4;
  }
LAB_00113eb6:
  btorsim_bv_to_dec_char_cold_4();
LAB_00113ebb:
  pcStack_68 = pcVar15;
  btorsim_bv_to_dec_char_cold_2();
LAB_00113ec0:
  btorsim_bv_to_dec_char_cold_3();
  uVar8 = *(uint *)(pcStack_68 + 4);
  if ((uVar8 == 0) || (*(int *)(pcStack_68 + 8) != 0)) {
    return (char *)CONCAT71((int7)((ulong)extraout_RAX >> 8),uVar8 == 0);
  }
  lVar13 = 0;
  do {
    iVar9 = (int)lVar13;
    if (uVar8 - 1 == iVar9) break;
    lVar1 = lVar13 * 4;
    lVar13 = lVar13 + 1;
  } while (*(int *)(pcStack_68 + lVar1 + 0xc) == 0);
  return (char *)(ulong)CONCAT31((int3)(uVar8 - 1 >> 8),uVar8 <= iVar9 + 1U);
LAB_00113eb1:
  btorsim_bv_to_dec_char_cold_1();
  goto LAB_00113eb6;
}

Assistant:

char *
btorsim_bv_to_hex_char (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t len, i, j, k, tmp;
  char *res, ch;

  len = (bv->width + 3) / 4;
  BTOR2_CNEWN (res, len + 1);
  for (i = 0, j = len - 1; i < bv->width;)
  {
    tmp = btorsim_bv_get_bit (bv, i++);
    for (k = 1; i < bv->width && k <= 3; i++, k++)
      tmp |= btorsim_bv_get_bit (bv, i) << k;
    ch       = tmp < 10 ? '0' + tmp : 'a' + (tmp - 10);
    res[j--] = ch;
  }

  return res;
}